

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

string * __thiscall
glcts::anon_unknown_0::CComputeBase::Csh<glcts::(anonymous_namespace)::test_api::ES3>
          (string *__return_storage_ptr__,CComputeBase *this)

{
  bool in_DL;
  string local_38;
  CComputeBase *local_18;
  CComputeBase *this_local;
  
  local_18 = this;
  this_local = (CComputeBase *)__return_storage_ptr__;
  glcts::(anonymous_namespace)::test_api::ES3::glslVer_abi_cxx11_
            (&local_38,(ES3 *)&DAT_00000001,in_DL);
  std::operator+(__return_storage_ptr__,&local_38,
                 "\nprecision highp int;                                           \nprecision highp float;                                         \n                                                               \nlayout(local_size_x = 1) in;                                   \nlayout(std430, binding = 0) buffer Vertices {                  \n    vec4 vertices[];                                           \n};                                                             \nlayout(std430, binding = 1) buffer Colors {                    \n    vec4 colors[];                                             \n};                                                             \nlayout(std430, binding = 2) buffer Indirect {                  \n    uint indirect[4];                                          \n};                                                             \n                                                               \nuniform uint height;                                           \nuniform uint width;                                            \n                                                               \nvoid main() {                                                  \n    uint w = gl_GlobalInvocationID.x;                          \n    uint h = gl_GlobalInvocationID.y;                          \n    float stepX = 2.0 / float(width);                          \n    float stepY = 2.0 / float(height);                         \n    float offsetX = -1.0 + stepX * float(w) + stepX / 2.0;     \n    float offsetY = -1.0 + stepY * float(h) + stepY / 2.0;     \n    uint arrayOffset = h * width + w;                          \n    vertices[ arrayOffset ] = vec4(offsetX, offsetY, 0.0, 1.0);\n    vec4 color = vec4(0.0, 0.0, 0.0, 1.0);                     \n    if(w > (width / 2u - 1u)) {                                \n        color = color + vec4(0.5, 0.0, 0.0, 0.0);              \n    }                                                          \n    if(h > (height / 2u - 1u)) {                               \n        color = color + vec4(0.0, 0.5, 0.0, 0.0);              ..." /* TRUNCATED STRING LITERAL */
                );
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Csh()
	{
		return api::glslVer(true) + NL "precision highp int;                                           " NL
									   "precision highp float;                                         " NL
									   "                                                               " NL
									   "layout(local_size_x = 1) in;                                   " NL
									   "layout(std430, binding = 0) buffer Vertices {                  " NL
									   "    vec4 vertices[];                                           " NL
									   "};                                                             " NL
									   "layout(std430, binding = 1) buffer Colors {                    " NL
									   "    vec4 colors[];                                             " NL
									   "};                                                             " NL
									   "layout(std430, binding = 2) buffer Indirect {                  " NL
									   "    uint indirect[4];                                          " NL
									   "};                                                             " NL
									   "                                                               " NL
									   "uniform uint height;                                           " NL
									   "uniform uint width;                                            " NL
									   "                                                               " NL
									   "void main() {                                                  " NL
									   "    uint w = gl_GlobalInvocationID.x;                          " NL
									   "    uint h = gl_GlobalInvocationID.y;                          " NL
									   "    float stepX = 2.0 / float(width);                          " NL
									   "    float stepY = 2.0 / float(height);                         " NL
									   "    float offsetX = -1.0 + stepX * float(w) + stepX / 2.0;     " NL
									   "    float offsetY = -1.0 + stepY * float(h) + stepY / 2.0;     " NL
									   "    uint arrayOffset = h * width + w;                          " NL
									   "    vertices[ arrayOffset ] = vec4(offsetX, offsetY, 0.0, 1.0);" NL
									   "    vec4 color = vec4(0.0, 0.0, 0.0, 1.0);                     " NL
									   "    if(w > (width / 2u - 1u)) {                                " NL
									   "        color = color + vec4(0.5, 0.0, 0.0, 0.0);              " NL
									   "    }                                                          " NL
									   "    if(h > (height / 2u - 1u)) {                               " NL
									   "        color = color + vec4(0.0, 0.5, 0.0, 0.0);              " NL
									   "    }                                                          " NL
									   "    colors[ arrayOffset ] = color;                             " NL
									   "    if(w == 0u && h == 0u) {                                   " NL
									   "        indirect[0] = width * height;                          " NL
									   "        indirect[1] =  1u;                                     " NL
									   "    }                                                          " NL
									   "}                                                              ";
	}